

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

string * GetDelimitedString_abi_cxx11_(string *__return_storage_ptr__,char **p)

{
  delim_string_t local_38;
  
  GetDelimitedStringEx_abi_cxx11_(&local_38,p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.first._M_dataplus._M_p == &local_38.first.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_38.first.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.first.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38.first._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_38.first.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_38.first._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::string GetDelimitedString(char*& p) {
	return GetDelimitedStringEx(p).first;	// throw away delimiter type and return just string
}